

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::NetDeclarationSyntax::NetDeclarationSyntax
          (NetDeclarationSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes
          ,Token netType,NetStrengthSyntax *strength,Token expansionHint,DataTypeSyntax *type,
          TimingControlSyntax *delay,
          SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,Token semi)

{
  bool bVar1;
  DataTypeSyntax *pDVar2;
  DeclaratorSyntax *pDVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  DataTypeSyntax *in_R9;
  SyntaxNode *in_stack_00000018;
  DeclaratorSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *in_stack_ffffffffffffff78;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *this_00;
  undefined1 in_stack_ffffffffffffffa0 [16];
  MemberSyntax *in_stack_ffffffffffffffb0;
  DataTypeSyntax *local_38;
  DataTypeSyntax *local_30;
  undefined8 local_28;
  SyntaxNode *local_10;
  SyntaxNode *local_8;
  
  this_00 = (SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)&stack0x00000008;
  local_30 = in_R9;
  local_28 = in_R8;
  local_10 = in_RDX;
  local_8 = in_RCX;
  MemberSyntax::MemberSyntax
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa0._12_4_,
             in_stack_ffffffffffffffa0._0_8_);
  in_RDI[3].parent = local_10;
  in_RDI[3].previewNode = local_8;
  *(undefined8 *)(in_RDI + 4) = local_28;
  in_RDI[4].parent = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  in_RDI[4].previewNode = *(SyntaxNode **)&(this_00->super_SyntaxListBase).super_SyntaxNode;
  local_38 = local_30;
  not_null<slang::syntax::DataTypeSyntax_*>::not_null<slang::syntax::DataTypeSyntax_*>
            ((not_null<slang::syntax::DataTypeSyntax_*> *)(in_RDI + 5),&local_38);
  in_RDI[5].parent = in_stack_00000018;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::SeparatedSyntaxList
            (this_00,in_stack_ffffffffffffff78);
  *(ParentList **)(in_RDI + 8) = __end2.list;
  in_RDI[8].parent = (SyntaxNode *)__end2.index;
  if (*(long *)(in_RDI + 4) != 0) {
    *(SyntaxNode **)(*(long *)(in_RDI + 4) + 8) = in_RDI;
  }
  pDVar2 = not_null<slang::syntax::DataTypeSyntax_*>::operator->
                     ((not_null<slang::syntax::DataTypeSyntax_*> *)0x574743);
  (pDVar2->super_ExpressionSyntax).super_SyntaxNode.parent = in_RDI;
  if (in_RDI[5].parent != (SyntaxNode *)0x0) {
    (in_RDI[5].parent)->parent = in_RDI;
  }
  in_RDI[6].parent = in_RDI;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
            ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x57478a);
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end(this_00);
  while( true ) {
    bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                      ((self_type *)this_00,
                       (iterator_base<slang::syntax::DeclaratorSyntax_*> *)in_stack_ffffffffffffff78
                      );
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pDVar3 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
             ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                          *)0x5747c9);
    (pDVar3->super_SyntaxNode).parent = in_RDI;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
    ::
    operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
              ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                *)this_00);
  }
  return;
}

Assistant:

NetDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token netType, NetStrengthSyntax* strength, Token expansionHint, DataTypeSyntax& type, TimingControlSyntax* delay, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::NetDeclaration, attributes), netType(netType), strength(strength), expansionHint(expansionHint), type(&type), delay(delay), declarators(declarators), semi(semi) {
        if (this->strength) this->strength->parent = this;
        this->type->parent = this;
        if (this->delay) this->delay->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }